

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  ImVector<unsigned_short> *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  ImDrawListSplitter *pIVar10;
  ImGuiTableColumn *pIVar11;
  ImDrawCmd *pIVar12;
  ImDrawChannel *pIVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  unsigned_short *puVar16;
  int iVar17;
  ImGuiContext *pIVar18;
  long lVar19;
  ulong uVar20;
  ImDrawChannel *pIVar21;
  int n;
  int iVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  float *pfVar28;
  ulong uVar29;
  int iVar30;
  ImDrawChannel *pIVar31;
  bool bVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  ImBitArray<132,_0> remaining_mask;
  MergeGroup merge_groups [4];
  ImBitArray<132,_0> local_f8;
  undefined8 uStack_e4;
  float fStack_dc;
  undefined8 local_d8;
  float local_d0 [2];
  int iStack_c8;
  uint local_c4 [37];
  
  pIVar18 = GImGui;
  pIVar10 = table->DrawSplitter;
  cVar7 = table->FreezeRowsCount;
  cVar8 = table->FreezeColumnsCount;
  lVar19 = 0x14;
  do {
    *(undefined8 *)((long)local_f8.Storage + lVar19 + 0xc) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar19) = 0;
    *(undefined8 *)((long)&local_d8 + lVar19) = 0;
    *(undefined8 *)((long)local_d0 + lVar19) = 0;
    *(undefined4 *)((long)&iStack_c8 + lVar19) = 0;
    *(undefined4 *)((long)&fStack_dc + lVar19) = 0;
    lVar19 = lVar19 + 0x28;
  } while (lVar19 != 0xb4);
  if (0 < table->ColumnsCount) {
    uVar20 = 0;
    uVar25 = 0;
    do {
      if ((table->VisibleMaskByIndex >> (uVar20 & 0x3f) & 1) != 0) {
        pIVar11 = (table->Columns).Data;
        iVar26 = 0;
        do {
          bVar9 = *(byte *)((long)pIVar11 + (0x59 - (ulong)(iVar26 == 0)) + uVar20 * 0x68);
          pIVar21 = (pIVar10->_Channels).Data;
          pIVar31 = pIVar21 + bVar9;
          iVar22 = pIVar21[bVar9]._CmdBuffer.Size;
          lVar19 = (long)iVar22;
          if (0 < lVar19) {
            pIVar12 = (pIVar31->_CmdBuffer).Data;
            if ((pIVar12[lVar19 + -1].ElemCount == 0) &&
               (pIVar12[lVar19 + -1].UserCallback == (ImDrawCallback)0x0)) {
              (pIVar31->_CmdBuffer).Size = iVar22 + -1;
            }
          }
          if ((pIVar31->_CmdBuffer).Size == 1) {
            if ((pIVar11[uVar20].Flags & 0x100) == 0) {
              if (cVar7 < '\x01') {
                fVar34 = pIVar11[uVar20].ContentMaxXUnfrozen;
LAB_00235c41:
                uVar33 = -(uint)(pIVar11[uVar20].ContentMaxXHeadersUsed <= fVar34);
                fVar34 = (float)(~uVar33 & (uint)pIVar11[uVar20].ContentMaxXHeadersUsed |
                                (uint)fVar34 & uVar33);
              }
              else {
                if (iVar26 == 0) {
                  fVar34 = pIVar11[uVar20].ContentMaxXFrozen;
                  goto LAB_00235c41;
                }
                fVar34 = pIVar11[uVar20].ContentMaxXUnfrozen;
              }
              pIVar1 = &pIVar11[uVar20].ClipRect.Max;
              if (pIVar1->x <= fVar34 && fVar34 != pIVar1->x) goto LAB_00235d18;
            }
            if (cVar8 < '\x01') {
              uVar33 = 1;
            }
            else {
              uVar33 = (uint)((long)table->FreezeColumnsCount <= (long)uVar20);
            }
            uVar27 = (uint)(iVar26 != 0) * 2;
            if (cVar7 < '\x01') {
              uVar27 = 2;
            }
            uVar24 = (ulong)(uVar27 | uVar33);
            pfVar28 = (float *)(&local_d8 + uVar24 * 5);
            if (local_c4[uVar24 * 10 + -1] == 0) {
              pfVar28[0] = 3.4028235e+38;
              pfVar28[1] = 3.4028235e+38;
              (local_d0 + uVar24 * 10)[0] = -3.4028235e+38;
              (local_d0 + uVar24 * 10)[1] = -3.4028235e+38;
            }
            local_c4[uVar24 * 10 + (ulong)(bVar9 >> 5)] =
                 local_c4[uVar24 * 10 + (ulong)(bVar9 >> 5)] | 1 << (bVar9 & 0x1f);
            local_c4[uVar24 * 10 + -1] = local_c4[uVar24 * 10 + -1] + 1;
            pIVar12 = (pIVar31->_CmdBuffer).Data;
            fVar34 = (pIVar12->ClipRect).x;
            if (fVar34 < *pfVar28) {
              *pfVar28 = fVar34;
            }
            fVar34 = (pIVar12->ClipRect).y;
            if (fVar34 < local_d0[uVar24 * 10 + -1]) {
              local_d0[uVar24 * 10 + -1] = fVar34;
            }
            fVar34 = (pIVar12->ClipRect).z;
            if (local_d0[uVar24 * 10] <= fVar34 && fVar34 != local_d0[uVar24 * 10]) {
              local_d0[uVar24 * 10] = fVar34;
            }
            fVar34 = (pIVar12->ClipRect).w;
            if (local_d0[uVar24 * 10 + 1] <= fVar34 && fVar34 != local_d0[uVar24 * 10 + 1]) {
              local_d0[uVar24 * 10 + 1] = fVar34;
            }
            uVar25 = uVar25 | 1 << (uVar27 | uVar33);
          }
LAB_00235d18:
          bVar32 = iVar26 == 0;
          iVar26 = iVar26 + -1;
        } while (('\0' < cVar7) && (bVar32));
        pIVar11[uVar20].DrawChannelCurrent = 0xff;
      }
      uVar20 = uVar20 + 1;
    } while ((long)uVar20 < (long)table->ColumnsCount);
    if (uVar25 != 0) {
      iVar22 = pIVar10->_Count + -2;
      iVar26 = (pIVar18->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar26 < iVar22) {
        if (iVar26 == 0) {
          iVar30 = 8;
        }
        else {
          iVar30 = iVar26 / 2 + iVar26;
        }
        if (iVar30 <= iVar22) {
          iVar30 = iVar22;
        }
        if (iVar26 < iVar30) {
          pIVar21 = (ImDrawChannel *)MemAlloc((long)iVar30 << 5);
          pIVar31 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
          if (pIVar31 != (ImDrawChannel *)0x0) {
            memcpy(pIVar21,pIVar31,(long)(pIVar18->DrawChannelsTempMergeBuffer).Size << 5);
            MemFree((pIVar18->DrawChannelsTempMergeBuffer).Data);
          }
          (pIVar18->DrawChannelsTempMergeBuffer).Data = pIVar21;
          (pIVar18->DrawChannelsTempMergeBuffer).Capacity = iVar30;
        }
      }
      (pIVar18->DrawChannelsTempMergeBuffer).Size = iVar22;
      pIVar31 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
      local_f8.Storage[0] = 0;
      local_f8.Storage[1] = 0;
      local_f8.Storage[2] = 0;
      local_f8.Storage[3] = 0;
      local_f8.Storage[4] = 0;
      ImBitArray<132,_0>::SetBitRange(&local_f8,2,pIVar10->_Count);
      bVar9 = table->Bg2DrawChannelUnfrozen & 0x1f;
      local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
           local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
           (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
      iVar26 = (pIVar10->_Count - (uint)('\0' < cVar7)) + -2;
      fVar34 = (table->HostClipRect).Min.x;
      fVar4 = (table->HostClipRect).Min.y;
      fVar5 = (table->HostClipRect).Max.x;
      fVar6 = (table->HostClipRect).Max.y;
      lVar19 = (long)local_c4;
      uVar20 = 0;
      do {
        iVar22 = local_c4[uVar20 * 10 + -1];
        if (iVar22 != 0) {
          fVar36 = *(float *)(&local_d8 + uVar20 * 5);
          fVar35 = fVar36;
          if (fVar34 <= fVar36) {
            fVar35 = fVar34;
          }
          fVar37 = fVar35;
          if ('\0' < cVar8) {
            fVar37 = fVar36;
          }
          fVar36 = local_d0[uVar20 * 10 + -1];
          fVar38 = fVar36;
          if (fVar4 <= fVar36) {
            fVar38 = fVar4;
          }
          if (cVar7 < '\x01') {
            fVar36 = fVar38;
          }
          bVar32 = (uVar20 & 1) != 0;
          if (bVar32) {
            fVar35 = fVar37;
          }
          fVar37 = local_d0[uVar20 * 10];
          if (bVar32) {
            uVar25 = -(uint)(fVar5 <= fVar37);
            fVar37 = (float)(~uVar25 & (uint)fVar5 | uVar25 & (uint)fVar37);
          }
          if (uVar20 < 2) {
            fVar36 = fVar38;
          }
          fVar38 = local_d0[uVar20 * 10 + 1];
          if ((uVar20 >= 2) && ((table->Flags & 0x20000) == 0)) {
            uVar25 = -(uint)(fVar6 <= fVar38);
            fVar38 = (float)((uint)fVar38 & uVar25 | ~uVar25 & (uint)fVar6);
          }
          lVar23 = 0;
          do {
            local_f8.Storage[lVar23] = local_f8.Storage[lVar23] & ~*(uint *)(lVar19 + lVar23 * 4);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 5);
          iVar26 = iVar26 - iVar22;
          if (0 < pIVar10->_Count) {
            lVar23 = 8;
            uVar24 = 0;
            do {
              uVar29 = uVar24 >> 5 & 0x7ffffff;
              if ((local_c4[uVar20 * 10 + uVar29] >> ((uint)uVar24 & 0x1f) & 1) != 0) {
                local_c4[uVar20 * 10 + uVar29] =
                     local_c4[uVar20 * 10 + uVar29] & ~(1 << ((byte)uVar24 & 0x1f));
                iVar22 = iVar22 + -1;
                pIVar21 = (pIVar10->_Channels).Data;
                pfVar28 = *(float **)((long)&(pIVar21->_CmdBuffer).Size + lVar23);
                *pfVar28 = fVar35;
                pfVar28[1] = fVar36;
                pfVar28[2] = fVar37;
                pfVar28[3] = fVar38;
                puVar2 = (undefined8 *)((long)pIVar21 + lVar23 + -8);
                uVar14 = *puVar2;
                pIVar12 = (ImDrawCmd *)puVar2[1];
                puVar2 = (undefined8 *)((long)&(pIVar21->_CmdBuffer).Data + lVar23);
                uVar15 = *puVar2;
                puVar16 = (unsigned_short *)puVar2[1];
                (pIVar31->_IdxBuffer).Size = (int)uVar15;
                (pIVar31->_IdxBuffer).Capacity = (int)((ulong)uVar15 >> 0x20);
                (pIVar31->_IdxBuffer).Data = puVar16;
                (pIVar31->_CmdBuffer).Size = (int)uVar14;
                (pIVar31->_CmdBuffer).Capacity = (int)((ulong)uVar14 >> 0x20);
                (pIVar31->_CmdBuffer).Data = pIVar12;
                pIVar31 = pIVar31 + 1;
              }
              uVar24 = uVar24 + 1;
            } while (((long)uVar24 < (long)pIVar10->_Count) && (lVar23 = lVar23 + 0x20, iVar22 != 0)
                    );
          }
        }
        if (uVar20 == 1 && '\0' < cVar7) {
          pIVar13 = (pIVar10->_Channels).Data;
          pIVar21 = pIVar13 + table->Bg2DrawChannelUnfrozen;
          iVar30 = (pIVar21->_CmdBuffer).Size;
          iVar17 = (pIVar21->_CmdBuffer).Capacity;
          pIVar12 = (pIVar21->_CmdBuffer).Data;
          pIVar3 = &pIVar13[table->Bg2DrawChannelUnfrozen]._IdxBuffer;
          iVar22 = pIVar3->Capacity;
          puVar16 = pIVar3->Data;
          (pIVar31->_IdxBuffer).Size = pIVar3->Size;
          (pIVar31->_IdxBuffer).Capacity = iVar22;
          (pIVar31->_IdxBuffer).Data = puVar16;
          (pIVar31->_CmdBuffer).Size = iVar30;
          (pIVar31->_CmdBuffer).Capacity = iVar17;
          (pIVar31->_CmdBuffer).Data = pIVar12;
          pIVar31 = pIVar31 + 1;
        }
        uVar20 = uVar20 + 1;
        lVar19 = lVar19 + 0x28;
      } while (uVar20 != 4);
      iVar22 = pIVar10->_Count;
      if ((0 < iVar22) && (iVar26 != 0)) {
        lVar19 = 0;
        uVar20 = 0;
        do {
          if ((local_f8.Storage[uVar20 >> 5 & 0x7ffffff] >> ((uint)uVar20 & 0x1f) & 1) != 0) {
            pIVar21 = (pIVar10->_Channels).Data;
            puVar2 = (undefined8 *)((long)&(pIVar21->_CmdBuffer).Size + lVar19);
            uVar14 = *puVar2;
            pIVar12 = (ImDrawCmd *)puVar2[1];
            pIVar31->_IdxBuffer =
                 *(ImVector<unsigned_short> *)((long)&(pIVar21->_IdxBuffer).Size + lVar19);
            (pIVar31->_CmdBuffer).Size = (int)uVar14;
            (pIVar31->_CmdBuffer).Capacity = (int)((ulong)uVar14 >> 0x20);
            (pIVar31->_CmdBuffer).Data = pIVar12;
            pIVar31 = pIVar31 + 1;
            iVar26 = iVar26 + -1;
          }
          uVar20 = uVar20 + 1;
          iVar22 = pIVar10->_Count;
        } while (((long)uVar20 < (long)iVar22) && (lVar19 = lVar19 + 0x20, iVar26 != 0));
      }
      memcpy((pIVar10->_Channels).Data + 2,(pIVar18->DrawChannelsTempMergeBuffer).Data,
             (long)iVar22 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0 && src_channel->_CmdBuffer.back().UserCallback == NULL) // Equivalent of PopUnusedDrawCmd()
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}